

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.hpp
# Opt level: O1

Vector<Kernel::TermList> * Lib::Vector<Kernel::TermList>::allocate(size_t length)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  Vector<Kernel::TermList> *pVVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  uVar5 = length * 8 + 0x17 & 0xfffffffffffffff0;
  if (uVar5 == 0) {
    pVVar3 = (Vector<Kernel::TermList> *)
             FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar5 < 0x11) {
    pVVar3 = (Vector<Kernel::TermList> *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar5 < 0x19) {
    pVVar3 = (Vector<Kernel::TermList> *)
             FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar5 < 0x21) {
    pVVar3 = (Vector<Kernel::TermList> *)
             FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar5 < 0x31) {
    pVVar3 = (Vector<Kernel::TermList> *)
             FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar5 < 0x41) {
    pVVar3 = (Vector<Kernel::TermList> *)
             FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pVVar3 = (Vector<Kernel::TermList> *)::operator_new(uVar5,0x10);
  }
  *(size_t *)pVVar3 = length;
  auVar2 = _DAT_00871040;
  auVar1 = _DAT_00871030;
  if (length != 0) {
    lVar4 = length - 1;
    auVar6._8_4_ = (int)lVar4;
    auVar6._0_8_ = lVar4;
    auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar6 = auVar6 ^ _DAT_00871040;
    do {
      auVar7._8_4_ = (int)uVar5;
      auVar7._0_8_ = uVar5;
      auVar7._12_4_ = (int)(uVar5 >> 0x20);
      auVar7 = (auVar7 | auVar1) ^ auVar2;
      if ((bool)(~(auVar7._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar7._0_4_ ||
                  auVar6._4_4_ < auVar7._4_4_) & 1)) {
        *(undefined8 *)(pVVar3 + uVar5 * 8 + 8) = 2;
      }
      if ((auVar7._12_4_ != auVar6._12_4_ || auVar7._8_4_ <= auVar6._8_4_) &&
          auVar7._12_4_ <= auVar6._12_4_) {
        *(undefined8 *)(pVVar3 + uVar5 * 8 + 0x10) = 2;
      }
      uVar5 = uVar5 + 2;
    } while ((length + 1 & 0xfffffffffffffffe) != uVar5);
  }
  return pVVar3;
}

Assistant:

static Vector* allocate(size_t length)
  {
    ASS_G(length,0);

    size_t sz=sizeof(Vector) + (length-1)*sizeof(C);
    Vector* v = reinterpret_cast<Vector*>(ALLOC_KNOWN(sz,"Vector"));
    v->_length = length;
    C* arr = v->_array;
    // in the case C is a class with an initialiser, apply the constructor of it
    // to every element of the allocated array
    array_new<C>(arr,length);
    return v;
  }